

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

string * var_to_str<long,2ul>(array<long,_2UL> *x)

{
  string *in_RDI;
  size_t i;
  string *s;
  string *this;
  string local_50 [32];
  allocator<char> *in_stack_ffffffffffffffd0;
  ulong uVar1;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator(&local_12);
  for (uVar1 = 0; uVar1 < 2; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::__cxx11::string::operator+=((string *)this,",");
    }
    std::array<long,_2UL>::operator[]((array<long,_2UL> *)this,(size_type)in_RDI);
    var_to_str<long>((long *)in_RDI);
    std::__cxx11::string::operator+=((string *)this,local_50);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::operator+=((string *)this,"]");
  return in_RDI;
}

Assistant:

static std::string var_to_str(const std::array<T, N> & x) {
    std::string s = "[";
    for (size_t i = 0; i < N; i++) {
        if (i > 0) {
            s += ",";
        }
        s += var_to_str(x[i]);
    }
    s += "]";
    return s;
}